

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

InstanceBuilder * __thiscall
vkb::InstanceBuilder::add_validation_disable(InstanceBuilder *this,VkValidationCheckEXT check)

{
  VkValidationCheckEXT local_14;
  InstanceBuilder *pIStack_10;
  VkValidationCheckEXT check_local;
  InstanceBuilder *this_local;
  
  local_14 = check;
  pIStack_10 = this;
  std::vector<VkValidationCheckEXT,_std::allocator<VkValidationCheckEXT>_>::push_back
            (&(this->info).disabled_validation_checks,&local_14);
  return this;
}

Assistant:

InstanceBuilder& InstanceBuilder::add_validation_disable(VkValidationCheckEXT check) {
    info.disabled_validation_checks.push_back(check);
    return *this;
}